

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O0

void get_pixels_in_1D_char_array_by_block_2x2(uint8_t *y_src,int stride,uint8_t *p_pixels_in1D)

{
  int j;
  int i;
  int index;
  uint8_t *p_pel;
  uint8_t *p_pixels_in1D_local;
  int stride_local;
  uint8_t *y_src_local;
  
  index = 0;
  p_pel = y_src;
  for (i = 0; i < 2; i = i + 1) {
    for (j = 0; j < 2; j = j + 1) {
      p_pixels_in1D[index] = p_pel[j];
      index = index + 1;
    }
    p_pel = p_pel + stride;
  }
  return;
}

Assistant:

static void get_pixels_in_1D_char_array_by_block_2x2(const uint8_t *y_src,
                                                     int stride,
                                                     uint8_t *p_pixels_in1D) {
  const uint8_t *p_pel = y_src;
  int index = 0;
  for (int i = 0; i < 2; i++) {
    for (int j = 0; j < 2; j++) {
      p_pixels_in1D[index++] = p_pel[j];
    }
    p_pel += stride;
  }
}